

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.hpp
# Opt level: O2

void clask::serve_dir(response_writer *resp,request *req,string *path)

{
  bool bVar1;
  path *this;
  ostream *poVar2;
  directory_iterator local_2a8;
  directory_iterator __end1;
  path local_280;
  __shared_ptr<std::filesystem::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2> local_258;
  string fn;
  __shared_ptr<std::filesystem::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2> local_228;
  __shared_ptr<std::filesystem::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2> local_218;
  string local_208;
  wstring wpath;
  string local_1c8;
  ostringstream os;
  string local_1a0 [368];
  
  to_wstring(&wpath,path);
  resp->code = 200;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_208,"content-type",(allocator<char> *)&local_280);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&os,"text/html; charset=utf-8",(allocator<char> *)&fn);
  response_writer::set_header(resp,&local_208,(string *)&os);
  std::__cxx11::string::~string((string *)&os);
  std::__cxx11::string::~string((string *)&local_208);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&os);
  std::operator<<((ostream *)&os,
                  "<!DOCTYPE html>\n<html>\n<head>\n<meta charset=\"UTF-8\">\n<title>");
  html_encode(&local_280._M_pathname,&req->uri);
  std::operator<<((ostream *)&os,(string *)&local_280);
  std::__cxx11::string::~string((string *)&local_280);
  std::operator<<((ostream *)&os,"</title>\n</head>\n<body>\n");
  std::__cxx11::stringbuf::str();
  (**resp->_vptr_response_writer)(resp,&local_280);
  std::__cxx11::string::~string((string *)&local_280);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_280,"",(allocator<char> *)&fn)
  ;
  std::__cxx11::stringbuf::str(local_1a0);
  std::__cxx11::string::~string((string *)&local_280);
  std::ios::clear((int)*(undefined8 *)(_os + -0x18) + (int)&os);
  std::filesystem::__cxx11::path::path<std::__cxx11::wstring,std::filesystem::__cxx11::path>
            (&local_280,&wpath,auto_format);
  std::filesystem::__cxx11::directory_iterator::directory_iterator
            ((directory_iterator *)&local_258,&local_280);
  std::filesystem::__cxx11::path::~path(&local_280);
  std::__shared_ptr<std::filesystem::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_228,&local_258);
  local_2a8._M_dir._M_ptr = local_228._M_ptr;
  local_2a8._M_dir._M_refcount._M_pi = local_228._M_refcount._M_pi;
  local_228._M_ptr = (element_type *)0x0;
  local_228._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_228._M_refcount);
  std::__shared_ptr<std::filesystem::__cxx11::_Dir,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_218,&local_258);
  __end1._M_dir._M_ptr = (element_type *)0x0;
  __end1._M_dir._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_218._M_refcount);
  while (local_2a8._M_dir._M_refcount._M_pi != __end1._M_dir._M_refcount._M_pi) {
    this = (path *)std::filesystem::__cxx11::directory_iterator::operator*(&local_2a8);
    std::filesystem::__cxx11::path::filename(&local_280,this);
    std::filesystem::__cxx11::path::string(&fn,&local_280);
    std::filesystem::__cxx11::path::~path(&local_280);
    bVar1 = std::filesystem::__cxx11::directory_entry::is_directory((directory_entry *)this);
    if (bVar1) {
      std::__cxx11::string::append((char *)&fn);
    }
    poVar2 = std::operator<<((ostream *)&os,"<a href=\"");
    url_encode(&local_280._M_pathname,&fn,false);
    poVar2 = std::operator<<(poVar2,(string *)&local_280);
    poVar2 = std::operator<<(poVar2,"\">");
    html_encode(&local_1c8,&fn);
    poVar2 = std::operator<<(poVar2,(string *)&local_1c8);
    std::operator<<(poVar2,"</a></br>\n");
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__cxx11::string::~string((string *)&local_280);
    std::__cxx11::stringbuf::str();
    (**resp->_vptr_response_writer)(resp,&local_280);
    std::__cxx11::string::~string((string *)&local_280);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_280,"",(allocator<char> *)&local_1c8);
    std::__cxx11::stringbuf::str(local_1a0);
    std::__cxx11::string::~string((string *)&local_280);
    std::ios::clear((int)*(undefined8 *)(_os + -0x18) + (int)&os);
    std::__cxx11::string::~string((string *)&fn);
    std::filesystem::__cxx11::directory_iterator::operator++(&local_2a8);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&__end1._M_dir._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_2a8._M_dir._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_258._M_refcount);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_280,"</body>\n</html>\n",(allocator<char> *)&fn);
  (**resp->_vptr_response_writer)(resp,&local_280);
  std::__cxx11::string::~string((string *)&local_280);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&os);
  std::__cxx11::wstring::~wstring((wstring *)&wpath);
  return;
}

Assistant:

inline void serve_dir(response_writer& resp, request& req, const std::string& path) {
  auto wpath = to_wstring(path);

  resp.code = 200;
  resp.set_header("content-type", "text/html; charset=utf-8");
  std::ostringstream os;
  os << "<!DOCTYPE html>\n<html>\n<head>\n<meta charset=\"UTF-8\">\n<title>";
  os << html_encode(req.uri);
  os << "</title>\n</head>\n<body>\n";
  resp.write(os.str());
  os.str("");
  os.clear(std::stringstream::goodbit);

  for (const auto& e : std::filesystem::directory_iterator(wpath)) {
    auto fn = e.path().filename().string();
    if (e.is_directory()) fn += "/";
    os << "<a href=\"" << url_encode(fn, false) << "\">" << html_encode(fn) << "</a></br>\n";
    resp.write(os.str());
    os.str("");
    os.clear(std::stringstream::goodbit);
  }
  resp.write("</body>\n</html>\n");
}